

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT<double>(TPZMultiphysicsElement *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  TPZCompMesh *pTVar8;
  TPZCompEl *this_00;
  long lVar9;
  long lVar10;
  TPZFMatrix<double> *this_01;
  TPZFMatrix<double> *this_02;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iload;
  ulong col;
  int iVar16;
  
  uVar6 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x270))();
  pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  uVar4 = (uint)((pTVar8->fSolution).fBaseMatrix)->fCol;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar13 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
  }
  iVar15 = 0;
  for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
    this_00 = (TPZCompEl *)(**(code **)(*(long *)&this->super_TPZCompEl + 0x268))(this,uVar14);
    if ((this_00 != (TPZCompEl *)0x0) &&
       (cVar5 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x2f8))(this,uVar14 & 0xffffffff),
       cVar5 != '\0')) {
      iVar7 = (**(code **)(*(long *)this_00 + 0x90))();
      iVar16 = 0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      for (; iVar16 != iVar7; iVar16 = iVar16 + 1) {
        lVar9 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa8))(this,iVar15);
        lVar10 = (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar16);
        iVar2 = *(int *)(lVar9 + 8);
        iVar3 = *(int *)(lVar10 + 8);
        pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
        uVar6 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar2].dim;
        pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
        iVar2 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar2].pos;
        pTVar8 = TPZCompEl::Mesh(this_00);
        iVar3 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar3].pos;
        pTVar8 = TPZCompEl::Mesh(this_00);
        this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fSolution);
        pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
        this_02 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fSolution);
        if ((int)uVar6 < 1) {
          uVar6 = 0;
        }
        for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
          for (col = 0; uVar4 != col; col = col + 1) {
            pdVar11 = TPZFMatrix<double>::operator()(this_02,uVar12 + (long)iVar2,col);
            dVar1 = *pdVar11;
            pdVar11 = TPZFMatrix<double>::operator()(this_01,uVar12 + (long)iVar3,col);
            *pdVar11 = dVar1;
          }
        }
        iVar15 = iVar15 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT()
{
    int nmeshes = this->NMeshes();
    int icon = 0;
    int nload = this->Mesh()->Solution().Cols();
    for (int imesh = 0; imesh < nmeshes; imesh++) {
        TPZCompEl *cel = this->ReferredElement(imesh);
        if (!cel) {
            continue;
        }
        if(!this->IsActiveApproxSpaces(imesh)){
            continue;
        }
        int ncon = cel->NConnects();
        for (int iconloc = 0; iconloc < ncon; iconloc++, icon++) {
            TPZConnect &con = this->Connect(icon);
            TPZConnect &conloc = cel->Connect(iconloc);
            int64_t seq = con.SequenceNumber();
            int64_t seqloc = conloc.SequenceNumber();
            int blsz = this->Mesh()->Block().Size(seq);

#ifdef PZDEBUG
            int blszloc = cel->Mesh()->Block().Size(seqloc);
            if (blsz != blszloc) {
                DebugStop();
            }
#endif
            int pos = this->Mesh()->Block().Position(seq);
            int posloc = cel->Mesh()->Block().Position(seqloc);
            TPZFMatrix<TVar> &celSol = cel->Mesh()->Solution();
            TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();
            for (int ibl = 0; ibl < blsz; ibl++) {
                for (int iload = 0; iload < nload; iload++) {
                    celSol(posloc+ibl,iload) = meshSol(pos+ibl,iload);
                }

            }
        }
    }
}